

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

void hadamard_col4(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  
  sVar1 = *src_diff;
  sVar2 = src_diff[src_stride];
  sVar3 = src_diff[src_stride * 2];
  sVar4 = src_diff[src_stride * 3];
  sVar5 = (short)((int)sVar4 + (int)sVar3 >> 1);
  sVar6 = (short)((int)sVar2 + (int)sVar1 >> 1);
  *coeff = sVar5 + sVar6;
  sVar3 = (short)((int)sVar3 - (int)sVar4 >> 1);
  sVar1 = (short)((int)sVar1 - (int)sVar2 >> 1);
  coeff[1] = sVar3 + sVar1;
  coeff[2] = sVar6 - sVar5;
  coeff[3] = sVar1 - sVar3;
  return;
}

Assistant:

static void hadamard_col4(const int16_t *src_diff, ptrdiff_t src_stride,
                          int16_t *coeff) {
  int16_t b0 = (src_diff[0 * src_stride] + src_diff[1 * src_stride]) >> 1;
  int16_t b1 = (src_diff[0 * src_stride] - src_diff[1 * src_stride]) >> 1;
  int16_t b2 = (src_diff[2 * src_stride] + src_diff[3 * src_stride]) >> 1;
  int16_t b3 = (src_diff[2 * src_stride] - src_diff[3 * src_stride]) >> 1;

  coeff[0] = b0 + b2;
  coeff[1] = b1 + b3;
  coeff[2] = b0 - b2;
  coeff[3] = b1 - b3;
}